

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O1

void __thiscall
re2::TestInstance::LogMatch
          (TestInstance *this,char *prefix,Engine e,StringPiece *text,StringPiece *context,
          Anchor anchor)

{
  ostringstream *o;
  StringPiece *this_00;
  size_t sVar1;
  ostream *poVar2;
  MatchKind kind;
  ParseFlags flags;
  StringPiece *src;
  StringPiece *src_00;
  StringPiece *src_01;
  StringPiece *src_02;
  StringPiece SVar3;
  long local_2d0;
  undefined8 local_2c8;
  ushort local_2c0;
  undefined1 local_2be;
  StringPiece *local_2b8;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  pointer local_1d0;
  undefined4 local_1c8;
  StringPiece local_1c0;
  LogMessage local_1b0;
  
  local_2b8 = context;
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
             ,0x239,0);
  o = &local_1b0.str_;
  if (prefix == (char *)0x0) {
    std::ios::clear((int)o + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
  }
  else {
    sVar1 = strlen(prefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)o,prefix,sVar1);
  }
  SVar3 = EngineName(e);
  this_00 = local_2b8;
  local_1c0.ptr_ = SVar3.ptr_;
  local_1c0.length_ = SVar3.length_;
  poVar2 = operator<<((ostream *)o,&local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," regexp ",8);
  CEscape_abi_cxx11_(&local_1f0,(re2 *)this->regexp_str_,src);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  Regexp::ToString_abi_cxx11_(&local_230,this->regexp_);
  local_1d0 = local_230._M_dataplus._M_p;
  local_1c8 = (undefined4)local_230._M_string_length;
  CEscape_abi_cxx11_(&local_210,(re2 *)&local_1d0,src_00);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_210._M_dataplus._M_p,local_210._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," text ",6);
  CEscape_abi_cxx11_(&local_250,(re2 *)text,src_01);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") of context ",0xd);
  CEscape_abi_cxx11_(&local_270,(re2 *)this_00,src_02);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_270._M_dataplus._M_p,local_270._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (",2);
  FormatKind_abi_cxx11_(&local_290,(re2 *)(ulong)this->kind_,kind);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_290._M_dataplus._M_p,local_290._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  if (anchor == kUnanchored) {
    local_2c8 = 0x726f68636e616e75;
    local_2c0 = 0x6465;
    local_2d0 = 10;
    local_2be = 0;
  }
  else if (anchor == kAnchored) {
    local_2c8 = 0x6465726f68636e61;
    local_2d0 = 8;
    local_2c0 = local_2c0 & 0xff00;
  }
  else {
    local_2d0 = 3;
    local_2c8 = CONCAT44(local_2c8._4_4_,0x3f3f3f);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_2c8,local_2d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  FormatMode_abi_cxx11_(&local_2b0,(re2 *)(ulong)this->flags_,flags);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  LogMessage::~LogMessage(&local_1b0);
  return;
}

Assistant:

void TestInstance::LogMatch(const char* prefix, Engine e,
                            const StringPiece& text, const StringPiece& context,
                            Prog::Anchor anchor) {
  LOG(INFO) << prefix
    << EngineName(e)
    << " regexp "
    << CEscape(regexp_str_)
    << " "
    << CEscape(regexp_->ToString())
    << " text "
    << CEscape(text)
    << " ("
    << text.begin() - context.begin()
    << ","
    << text.end() - context.begin()
    << ") of context "
    << CEscape(context)
    << " (" << FormatKind(kind_)
    << ", " << FormatAnchor(anchor)
    << ", " << FormatMode(flags_)
    << ")";
}